

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapeLinear>::FirstShapeIndex(TPZVec<long> *Index,int *scalarorders)

{
  int iVar1;
  int iVar2;
  int iside;
  long lVar3;
  
  *Index->fStore = 0;
  iVar2 = 0;
  lVar3 = 0;
  do {
    iVar1 = 1;
    if (lVar3 == 2) {
      iVar1 = *scalarorders;
    }
    iVar1 = pzshape::TPZShapeLinear::NConnectShapeF((int)lVar3,iVar1);
    iVar2 = iVar2 + iVar1;
    Index->fStore[lVar3 + 1] = (long)iVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::FirstShapeIndex(TPZVec<int64_t> &Index, int &scalarorders) {
    Index[0] = 0;

    for(int iside=0;iside<TSHAPE::NSides;iside++)
    {
        int sideorder = 1;
        if (iside >= TSHAPE::NCornerNodes) {
            sideorder = scalarorders;
        }
        int temp = Index[iside] + TSHAPE::NConnectShapeF(iside,sideorder);
        Index[iside+1] = temp;
    }
}